

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg_ctr.c
# Opt level: O0

void inc_128(PROV_DRBG_CTR *ctr)

{
  uint uVar1;
  u32 c;
  u32 n;
  uchar *p;
  PROV_DRBG_CTR *ctr_local;
  
  n = 0x10;
  c = 1;
  do {
    n = n - 1;
    uVar1 = ctr->V[n] + c;
    ctr->V[n] = (uchar)uVar1;
    c = uVar1 >> 8;
  } while (n != 0);
  return;
}

Assistant:

static void inc_128(PROV_DRBG_CTR *ctr)
{
    unsigned char *p = &ctr->V[0];
    u32 n = 16, c = 1;

    do {
        --n;
        c += p[n];
        p[n] = (u8)c;
        c >>= 8;
    } while (n);
}